

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_add_passphrase.c
# Opt level: O0

int archive_read_set_passphrase_callback
              (archive *_a,void *client_data,archive_passphrase_callback *cb)

{
  int iVar1;
  int magic_test;
  archive_read *a;
  archive_passphrase_callback *cb_local;
  void *client_data_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_set_passphrase_callback");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    _a[0xe].read_data_offset = (int64_t)cb;
    _a[0xe].read_data_output_offset = (int64_t)client_data;
    _a_local._4_4_ = 0;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_set_passphrase_callback(struct archive *_a, void *client_data,
    archive_passphrase_callback *cb)
{
	struct archive_read *a = (struct archive_read *)_a;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
		"archive_read_set_passphrase_callback");

	a->passphrases.callback = cb;
	a->passphrases.client_data = client_data;
	return (ARCHIVE_OK);
}